

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal2mjd.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  pointer pcVar2;
  double dVar3;
  initializer_list<double> __l;
  allocator_type local_71;
  double local_70;
  string local_68;
  vector<double,_std::allocator<double>_> gregorian_vect;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_68,argv[1],(allocator *)&gregorian_vect);
    dVar3 = std::__cxx11::stod(&local_68,(size_t *)0x0);
    local_70 = (double)CEDate::Gregorian2MJD(dVar3);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    if (argc != 4) {
      poVar1 = std::operator<<((ostream *)&std::cout,"cal2mjd v");
      poVar1 = std::operator<<(poVar1,"1.3.0");
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cout,"\nUSAGE: May be called in one of two ways:\n");
      std::operator<<((ostream *)&std::cout,"    1: cal2mjd YYYYMMDD.<day fraction>\n");
      std::operator<<((ostream *)&std::cout,"    2: cal2mjd <year> <month> <day>.<day fraction>\n");
      std::operator<<((ostream *)&std::cout,"RETURNED: Modified Julian Date\n\n");
      return 0;
    }
    std::__cxx11::string::string((string *)&local_68,argv[1],(allocator *)&gregorian_vect);
    pcVar2 = (pointer)std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[2],(allocator *)&gregorian_vect);
    dVar3 = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[3],(allocator *)&gregorian_vect);
    local_70 = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    local_68._M_dataplus._M_p = pcVar2;
    local_68._M_string_length = (size_type)dVar3;
    local_68.field_2._M_allocated_capacity = (size_type)floor(local_70);
    local_68.field_2._8_8_ = 0;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_68;
    std::vector<double,_std::allocator<double>_>::vector(&gregorian_vect,__l,&local_71);
    gregorian_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[3] =
         local_70 -
         gregorian_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_20,&gregorian_vect);
    local_70 = (double)CEDate::GregorianVect2MJD(&local_20);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&gregorian_vect.super__Vector_base<double,_std::allocator<double>_>);
  }
  printf("%f\n",local_70);
  return 0;
}

Assistant:

int main(int argc, const char * argv[]) {
    
    // variable to hold the julian date
    double mjd(0.0) ;
    
    // Check that we've been passed an actual argument
    if ((argc != 2)&&(argc != 4)) {
        // Print some usage information
        std::cout << "cal2mjd v" << CPPEPHEM_VERSION << "\n";
        std::cout << "\nUSAGE: May be called in one of two ways:\n";
        std::cout << "    1: cal2mjd YYYYMMDD.<day fraction>\n" ;
        std::cout << "    2: cal2mjd <year> <month> <day>.<day fraction>\n" ;
        std::cout << "RETURNED: Modified Julian Date\n\n" ;
        return 0 ;
    } else if (argc == 2) {
        mjd = CEDate::Gregorian2MJD(std::stod(argv[1])) ;
    } else if (argc == 4) {
        // First get the year, month, day information from the pass parameters
        double year(std::stod(argv[1])), month(std::stod(argv[2])), day(std::stod(argv[3])) ;
        std::vector<double> gregorian_vect = {year, month, std::floor(day), 0.0} ;
        gregorian_vect[3] = day - gregorian_vect[2] ;
                
        // Now compute the julian date
        mjd = CEDate::GregorianVect2MJD(gregorian_vect) ;
    }
    
    // Print the result
    std::printf("%f\n", mjd) ;
    
    return 0 ;
}